

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BlendCase::BlendCase
          (BlendCase *this,Context *context,char *name,char *desc,
          vector<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
          *paramSets,bool useSrgbFbo)

{
  byte bVar1;
  RenderTarget *pRVar2;
  int iVar3;
  int iVar4;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlendCase_00c1b7a0;
  std::
  vector<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
  ::vector(&this->m_paramSets,paramSets);
  this->m_curParamSetNdx = 0;
  this->m_useSrgbFbo = useSrgbFbo;
  this->m_colorRbo = 0;
  this->m_fbo = 0;
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_referenceRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  deqp::gls::FragmentOpUtil::Quad::Quad(&this->m_firstQuad);
  deqp::gls::FragmentOpUtil::Quad::Quad(&this->m_secondQuad);
  deqp::gls::FragmentOpUtil::IntegerQuad::IntegerQuad(&this->m_firstQuadInt);
  deqp::gls::FragmentOpUtil::IntegerQuad::IntegerQuad(&this->m_secondQuadInt);
  bVar1 = this->m_useSrgbFbo;
  iVar4 = 0x80;
  iVar3 = 0x80;
  if ((bool)bVar1 == false) {
    pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar3 = pRVar2->m_width;
    bVar1 = this->m_useSrgbFbo;
  }
  this->m_renderWidth = iVar3;
  if ((bVar1 & 1) == 0) {
    pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar4 = pRVar2->m_height;
  }
  this->m_renderHeight = iVar4;
  this->m_viewportWidth = 0;
  this->m_viewportHeight = 0;
  return;
}

Assistant:

BlendCase::BlendCase (Context&						context,
					  const char*					name,
					  const char*					desc,
					  const vector<BlendParams>&	paramSets,
					  bool							useSrgbFbo)
	: TestCase				(context, name, desc)
	, m_paramSets			(paramSets)
	, m_curParamSetNdx		(0)
	, m_useSrgbFbo			(useSrgbFbo)
	, m_colorRbo			(0)
	, m_fbo					(0)
	, m_renderer			(DE_NULL)
	, m_referenceRenderer	(DE_NULL)
	, m_refColorBuffer		(DE_NULL)
	, m_renderWidth			(m_useSrgbFbo ? 2*MAX_VIEWPORT_WIDTH	: m_context.getRenderTarget().getWidth())
	, m_renderHeight		(m_useSrgbFbo ? 2*MAX_VIEWPORT_HEIGHT	: m_context.getRenderTarget().getHeight())
	, m_viewportWidth		(0)
	, m_viewportHeight		(0)
{
	DE_ASSERT(!m_paramSets.empty());
}